

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O3

void Imf_3_2::anon_unknown_3::interleaveByte2(char *dst,char *src0,char *src1,int numBytes)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  uint uVar34;
  ulong uVar36;
  __m128i *src1_epi8;
  __m128i *src0_epi8;
  __m128i *dst_epi8;
  ulong uVar37;
  long lVar38;
  int iVar35;
  
  iVar35 = numBytes + 0xf;
  if (-1 < numBytes) {
    iVar35 = numBytes;
  }
  uVar34 = iVar35 >> 4;
  if ((((uint)src0 | (uint)dst | (uint)src1) & 0xf) == 0) {
    if (0xf < numBytes) {
      uVar36 = (ulong)uVar34;
      lVar38 = 0;
      do {
        pcVar1 = src0 + lVar38;
        cVar3 = pcVar1[1];
        cVar4 = pcVar1[2];
        cVar5 = pcVar1[3];
        cVar6 = pcVar1[4];
        cVar7 = pcVar1[5];
        cVar8 = pcVar1[6];
        cVar9 = pcVar1[7];
        cVar10 = pcVar1[8];
        cVar11 = pcVar1[9];
        cVar12 = pcVar1[10];
        cVar13 = pcVar1[0xb];
        cVar14 = pcVar1[0xc];
        cVar15 = pcVar1[0xd];
        cVar16 = pcVar1[0xe];
        cVar17 = pcVar1[0xf];
        pcVar2 = src1 + lVar38;
        cVar18 = *pcVar2;
        cVar19 = pcVar2[1];
        cVar20 = pcVar2[2];
        cVar21 = pcVar2[3];
        cVar22 = pcVar2[4];
        cVar23 = pcVar2[5];
        cVar24 = pcVar2[6];
        cVar25 = pcVar2[7];
        cVar26 = pcVar2[8];
        cVar27 = pcVar2[9];
        cVar28 = pcVar2[10];
        cVar29 = pcVar2[0xb];
        cVar30 = pcVar2[0xc];
        cVar31 = pcVar2[0xd];
        cVar32 = pcVar2[0xe];
        cVar33 = pcVar2[0xf];
        pcVar2 = dst + lVar38 * 2;
        *pcVar2 = *pcVar1;
        pcVar2[1] = cVar18;
        pcVar2[2] = cVar3;
        pcVar2[3] = cVar19;
        pcVar2[4] = cVar4;
        pcVar2[5] = cVar20;
        pcVar2[6] = cVar5;
        pcVar2[7] = cVar21;
        pcVar2[8] = cVar6;
        pcVar2[9] = cVar22;
        pcVar2[10] = cVar7;
        pcVar2[0xb] = cVar23;
        pcVar2[0xc] = cVar8;
        pcVar2[0xd] = cVar24;
        pcVar2[0xe] = cVar9;
        pcVar2[0xf] = cVar25;
        pcVar1 = dst + lVar38 * 2 + 0x10;
        *pcVar1 = cVar10;
        pcVar1[1] = cVar26;
        pcVar1[2] = cVar11;
        pcVar1[3] = cVar27;
        pcVar1[4] = cVar12;
        pcVar1[5] = cVar28;
        pcVar1[6] = cVar13;
        pcVar1[7] = cVar29;
        pcVar1[8] = cVar14;
        pcVar1[9] = cVar30;
        pcVar1[10] = cVar15;
        pcVar1[0xb] = cVar31;
        pcVar1[0xc] = cVar16;
        pcVar1[0xd] = cVar32;
        pcVar1[0xe] = cVar17;
        pcVar1[0xf] = cVar33;
        lVar38 = lVar38 + 0x10;
        uVar36 = uVar36 - 1;
      } while (uVar36 != 0);
    }
    if ((int)(uVar34 * 0x10) < numBytes) {
      lVar38 = (long)(int)(uVar34 * 0x10);
      do {
        dst[lVar38 * 2] = src0[lVar38];
        dst[lVar38 * 2 + 1] = src1[lVar38];
        lVar38 = lVar38 + 1;
      } while (numBytes != lVar38);
    }
  }
  else if (((uint)src1 & 0xf) == 8 && (((uint)src0 & 0xf) == 8 && ((ulong)dst & 0xf) == 0)) {
    if (0 < numBytes) {
      uVar36 = 8;
      if ((uint)numBytes < 8) {
        uVar36 = (ulong)(uint)numBytes;
      }
      uVar37 = 0;
      do {
        dst[uVar37 * 2] = src0[uVar37];
        dst[uVar37 * 2 + 1] = src1[uVar37];
        uVar37 = uVar37 + 1;
      } while (uVar36 != uVar37);
      if (8 < numBytes) {
        uVar34 = numBytes - 8;
        if (0xf < uVar34) {
          uVar36 = (ulong)(uVar34 >> 4);
          lVar38 = 8;
          do {
            pcVar1 = src0 + lVar38;
            cVar3 = pcVar1[1];
            cVar4 = pcVar1[2];
            cVar5 = pcVar1[3];
            cVar6 = pcVar1[4];
            cVar7 = pcVar1[5];
            cVar8 = pcVar1[6];
            cVar9 = pcVar1[7];
            pcVar2 = src1 + lVar38;
            cVar10 = *pcVar2;
            cVar11 = pcVar2[1];
            cVar12 = pcVar2[2];
            cVar13 = pcVar2[3];
            cVar14 = pcVar2[4];
            cVar15 = pcVar2[5];
            cVar16 = pcVar2[6];
            cVar17 = pcVar2[7];
            pcVar2 = dst + lVar38 * 2;
            *pcVar2 = *pcVar1;
            pcVar2[1] = cVar10;
            pcVar2[2] = cVar3;
            pcVar2[3] = cVar11;
            pcVar2[4] = cVar4;
            pcVar2[5] = cVar12;
            pcVar2[6] = cVar5;
            pcVar2[7] = cVar13;
            pcVar2[8] = cVar6;
            pcVar2[9] = cVar14;
            pcVar2[10] = cVar7;
            pcVar2[0xb] = cVar15;
            pcVar2[0xc] = cVar8;
            pcVar2[0xd] = cVar16;
            pcVar2[0xe] = cVar9;
            pcVar2[0xf] = cVar17;
            cVar3 = src0[lVar38 + 9];
            cVar4 = src0[lVar38 + 10];
            cVar5 = src0[lVar38 + 0xb];
            cVar6 = src0[lVar38 + 0xc];
            cVar7 = src0[lVar38 + 0xd];
            cVar8 = src0[lVar38 + 0xe];
            cVar9 = src0[lVar38 + 0xf];
            cVar10 = src1[lVar38 + 8];
            cVar11 = src1[lVar38 + 9];
            cVar12 = src1[lVar38 + 10];
            cVar13 = src1[lVar38 + 0xb];
            cVar14 = src1[lVar38 + 0xc];
            cVar15 = src1[lVar38 + 0xd];
            cVar16 = src1[lVar38 + 0xe];
            cVar17 = src1[lVar38 + 0xf];
            pcVar1 = dst + lVar38 * 2 + 0x10;
            *pcVar1 = src0[lVar38 + 8];
            pcVar1[1] = cVar10;
            pcVar1[2] = cVar3;
            pcVar1[3] = cVar11;
            pcVar1[4] = cVar4;
            pcVar1[5] = cVar12;
            pcVar1[6] = cVar5;
            pcVar1[7] = cVar13;
            pcVar1[8] = cVar6;
            pcVar1[9] = cVar14;
            pcVar1[10] = cVar7;
            pcVar1[0xb] = cVar15;
            pcVar1[0xc] = cVar8;
            pcVar1[0xd] = cVar16;
            pcVar1[0xe] = cVar9;
            pcVar1[0xf] = cVar17;
            lVar38 = lVar38 + 0x10;
            uVar36 = uVar36 - 1;
          } while (uVar36 != 0);
        }
        if ((int)((uVar34 & 0xfffffff0) + 8) < numBytes) {
          lVar38 = (long)(int)(uVar34 & 0xfffffff0);
          do {
            dst[lVar38 * 2 + 0x10] = src0[lVar38 + 8];
            dst[lVar38 * 2 + 0x11] = src1[lVar38 + 8];
            lVar38 = lVar38 + 1;
          } while ((ulong)(uint)numBytes - 8 != lVar38);
        }
      }
    }
  }
  else {
    if (0xf < numBytes) {
      uVar36 = (ulong)uVar34;
      lVar38 = 0;
      do {
        pcVar1 = src0 + lVar38;
        cVar3 = pcVar1[1];
        cVar4 = pcVar1[2];
        cVar5 = pcVar1[3];
        cVar6 = pcVar1[4];
        cVar7 = pcVar1[5];
        cVar8 = pcVar1[6];
        cVar9 = pcVar1[7];
        cVar10 = pcVar1[8];
        cVar11 = pcVar1[9];
        cVar12 = pcVar1[10];
        cVar13 = pcVar1[0xb];
        cVar14 = pcVar1[0xc];
        cVar15 = pcVar1[0xd];
        cVar16 = pcVar1[0xe];
        cVar17 = pcVar1[0xf];
        pcVar2 = src1 + lVar38;
        cVar18 = *pcVar2;
        cVar19 = pcVar2[1];
        cVar20 = pcVar2[2];
        cVar21 = pcVar2[3];
        cVar22 = pcVar2[4];
        cVar23 = pcVar2[5];
        cVar24 = pcVar2[6];
        cVar25 = pcVar2[7];
        cVar26 = pcVar2[8];
        cVar27 = pcVar2[9];
        cVar28 = pcVar2[10];
        cVar29 = pcVar2[0xb];
        cVar30 = pcVar2[0xc];
        cVar31 = pcVar2[0xd];
        cVar32 = pcVar2[0xe];
        cVar33 = pcVar2[0xf];
        pcVar2 = dst + lVar38 * 2;
        *pcVar2 = *pcVar1;
        pcVar2[1] = cVar18;
        pcVar2[2] = cVar3;
        pcVar2[3] = cVar19;
        pcVar2[4] = cVar4;
        pcVar2[5] = cVar20;
        pcVar2[6] = cVar5;
        pcVar2[7] = cVar21;
        pcVar2[8] = cVar6;
        pcVar2[9] = cVar22;
        pcVar2[10] = cVar7;
        pcVar2[0xb] = cVar23;
        pcVar2[0xc] = cVar8;
        pcVar2[0xd] = cVar24;
        pcVar2[0xe] = cVar9;
        pcVar2[0xf] = cVar25;
        pcVar1 = dst + lVar38 * 2 + 0x10;
        *pcVar1 = cVar10;
        pcVar1[1] = cVar26;
        pcVar1[2] = cVar11;
        pcVar1[3] = cVar27;
        pcVar1[4] = cVar12;
        pcVar1[5] = cVar28;
        pcVar1[6] = cVar13;
        pcVar1[7] = cVar29;
        pcVar1[8] = cVar14;
        pcVar1[9] = cVar30;
        pcVar1[10] = cVar15;
        pcVar1[0xb] = cVar31;
        pcVar1[0xc] = cVar16;
        pcVar1[0xd] = cVar32;
        pcVar1[0xe] = cVar17;
        pcVar1[0xf] = cVar33;
        lVar38 = lVar38 + 0x10;
        uVar36 = uVar36 - 1;
      } while (uVar36 != 0);
    }
    if ((int)(uVar34 * 0x10) < numBytes) {
      lVar38 = (long)(int)(uVar34 * 0x10);
      do {
        dst[lVar38 * 2] = src0[lVar38];
        dst[lVar38 * 2 + 1] = src1[lVar38];
        lVar38 = lVar38 + 1;
      } while (numBytes != lVar38);
    }
  }
  return;
}

Assistant:

void
interleaveByte2 (char* dst, char* src0, char* src1, int numBytes)
{
    int dstAlignment  = (size_t) dst % 16;
    int src0Alignment = (size_t) src0 % 16;
    int src1Alignment = (size_t) src1 % 16;

    __m128i* dst_epi8  = (__m128i*) dst;
    __m128i* src0_epi8 = (__m128i*) src0;
    __m128i* src1_epi8 = (__m128i*) src1;
    int      sseWidth  = numBytes / 16;

    if ((!dstAlignment) && (!src0Alignment) && (!src1Alignment))
    {
        __m128i tmp0, tmp1;

        //
        // Aligned loads and stores
        //

        for (int x = 0; x < sseWidth; ++x)
        {
            tmp0 = src0_epi8[x];
            tmp1 = src1_epi8[x];

            _mm_stream_si128 (&dst_epi8[2 * x], _mm_unpacklo_epi8 (tmp0, tmp1));

            _mm_stream_si128 (
                &dst_epi8[2 * x + 1], _mm_unpackhi_epi8 (tmp0, tmp1));
        }

        //
        // Then do run the leftovers one at a time
        //

        for (int x = 16 * sseWidth; x < numBytes; ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }
    }
    else if ((!dstAlignment) && (src0Alignment == 8) && (src1Alignment == 8))
    {
        //
        // Aligned stores, but catch up a few values so we can
        // use aligned loads
        //

        for (int x = 0; x < std::min (numBytes, 8); ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }

        if (numBytes > 8)
        {
            dst_epi8  = (__m128i*) &dst[16];
            src0_epi8 = (__m128i*) &src0[8];
            src1_epi8 = (__m128i*) &src1[8];
            sseWidth  = (numBytes - 8) / 16;

            for (int x = 0; x < sseWidth; ++x)
            {
                _mm_stream_si128 (
                    &dst_epi8[2 * x],
                    _mm_unpacklo_epi8 (src0_epi8[x], src1_epi8[x]));

                _mm_stream_si128 (
                    &dst_epi8[2 * x + 1],
                    _mm_unpackhi_epi8 (src0_epi8[x], src1_epi8[x]));
            }

            //
            // Then do run the leftovers one at a time
            //

            for (int x = 16 * sseWidth + 8; x < numBytes; ++x)
            {
                dst[2 * x]     = src0[x];
                dst[2 * x + 1] = src1[x];
            }
        }
    }
    else
    {
        //
        // Unaligned everything
        //

        for (int x = 0; x < sseWidth; ++x)
        {
            __m128i tmpSrc0_epi8 = _mm_loadu_si128 (&src0_epi8[x]);
            __m128i tmpSrc1_epi8 = _mm_loadu_si128 (&src1_epi8[x]);

            _mm_storeu_si128 (
                &dst_epi8[2 * x],
                _mm_unpacklo_epi8 (tmpSrc0_epi8, tmpSrc1_epi8));

            _mm_storeu_si128 (
                &dst_epi8[2 * x + 1],
                _mm_unpackhi_epi8 (tmpSrc0_epi8, tmpSrc1_epi8));
        }

        //
        // Then do run the leftovers one at a time
        //

        for (int x = 16 * sseWidth; x < numBytes; ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }
    }
}